

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<unsigned_long>(Serializer *this,unsafe_vector<unsigned_long> *vec)

{
  pointer puVar1;
  unsigned_long *item;
  pointer puVar2;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(vec->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3);
  puVar1 = (vec->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (vec->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (*this->_vptr_Serializer[0x15])(this,*puVar2);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const unsafe_vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}